

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8,RegSlot R9,RegSlot R10,RegSlot R11,
          RegSlot R12,RegSlot R13,RegSlot R14,RegSlot R15,RegSlot R16,RegSlot R17)

{
  bool bVar1;
  uint local_74;
  uint uStack_70;
  OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  RegSlot R3_local;
  RegSlot R2_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  layout.R16 = R3;
  layout.R17 = R2;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&local_74,R0);
  if (((((((bVar1) &&
          (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&uStack_70,R1), bVar1))
         && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                               (&layout.R0,layout.R17), bVar1)) &&
        ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R1,layout.R16),
         bVar1 && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R2,R4),
                  bVar1)))) &&
       ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R3,R5), bVar1 &&
        ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R4,R6), bVar1 &&
         (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R5,R7), bVar1)))
        ))) && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R6,R8),
               bVar1)) &&
     (((((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R7,R9), bVar1 &&
         (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R8,R10), bVar1))
        && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R9,R11), bVar1
           )) && (((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                                      (&layout.R10,R12), bVar1 &&
                   (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                                      (&layout.R11,R13), bVar1)) &&
                  ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                                      (&layout.R12,R14), bVar1 &&
                   ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                                       (&layout.R13,R15), bVar1 &&
                    (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                                       (&layout.R14,R16), bVar1)))))))) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R15,R17), bVar1))))
  {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_74,0x48,
               &this->super_ByteCodeWriter,false);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg18(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8,
        RegSlot R9, RegSlot R10, RegSlot R11, RegSlot R12, RegSlot R13, RegSlot R14, RegSlot R15, RegSlot R16, RegSlot R17)
    {
        OpLayoutT_AsmReg18<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2) && SizePolicy::Assign(layout.R3, R3) && SizePolicy::Assign(layout.R4, R4) &&
            SizePolicy::Assign(layout.R5, R5) && SizePolicy::Assign(layout.R6, R6) && SizePolicy::Assign(layout.R7, R7) && SizePolicy::Assign(layout.R8, R8) && SizePolicy::Assign(layout.R9, R9) &&
            SizePolicy::Assign(layout.R10, R10) && SizePolicy::Assign(layout.R11, R11) && SizePolicy::Assign(layout.R12, R12) && SizePolicy::Assign(layout.R13, R13) && SizePolicy::Assign(layout.R14, R14) &&
            SizePolicy::Assign(layout.R15, R15) && SizePolicy::Assign(layout.R16, R16) && SizePolicy::Assign(layout.R17, R17))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }